

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies.cpp
# Opt level: O3

bool bidfx_public_api::price::Currencies::IsValidCurrencyPair(string *ccy_pair)

{
  int iVar1;
  int iVar2;
  string local_48;
  
  if (ccy_pair->_M_string_length != 6) {
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)ccy_pair);
  iVar1 = Precedence(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)ccy_pair);
    iVar2 = Precedence(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 != -1) {
      return iVar1 < iVar2;
    }
  }
  return false;
}

Assistant:

bool Currencies::IsValidCurrencyPair(const std::string& ccy_pair)
{
    if (!ccy_pair.empty())
    {
        if (ccy_pair.length() == 6)
        {
            int precedence1 = Precedence(ccy_pair.substr(0, 3));

            if (precedence1 != -1)
            {
                int precedence2 = Precedence(ccy_pair.substr(3, 6));

                if (precedence2 != -1)
                {
                    return precedence1 < precedence2;
                }
            }
        }
    }

    return false;
}